

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugUtils.cpp
# Opt level: O0

char16 * JsrtDebugUtils::GetClassName(TypeId typeId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16_t *pcStack_10;
  TypeId typeId_local;
  
  switch(typeId) {
  case TypeIds_Proxy:
    pcStack_10 = L"Proxy";
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugUtils.cpp"
                       ,0x1eb,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    pcStack_10 = L"";
    break;
  case TypeIds_Object:
  case TypeIds_ArrayIterator:
  case TypeIds_MapIterator:
  case TypeIds_SetIterator:
  case TypeIds_StringIterator:
    pcStack_10 = L"Object";
    break;
  case TypeIds_Array:
  case TypeIds_NativeIntArray:
  case TypeIds_CopyOnAccessNativeIntArray:
  case TypeIds_ArrayLast:
  case TypeIds_ArrayLastWithES5:
  case TypeIds_CharArray:
  case TypeIds_BoolArray:
    pcStack_10 = L"Array";
    break;
  case TypeIds_Date:
    pcStack_10 = L"Date";
    break;
  case TypeIds_RegEx:
    pcStack_10 = L"RegExp";
    break;
  case TypeIds_Error:
    pcStack_10 = L"Error";
    break;
  case TypeIds_BooleanObject:
    pcStack_10 = L"Boolean";
    break;
  case TypeIds_NumberObject:
    pcStack_10 = L"Number";
    break;
  case TypeIds_StringObject:
    pcStack_10 = L"String";
    break;
  case TypeIds_Arguments:
    pcStack_10 = L"Object";
    break;
  case TypeIds_ArrayBuffer:
    pcStack_10 = L"ArrayBuffer";
    break;
  case TypeIds_Int8Array:
    pcStack_10 = L"Int8Array";
    break;
  case TypeIds_Uint8Array:
    pcStack_10 = L"Uint8Array";
    break;
  case TypeIds_Uint8ClampedArray:
    pcStack_10 = L"Uint8ClampedArray";
    break;
  case TypeIds_Int16Array:
    pcStack_10 = L"Int16Array";
    break;
  case TypeIds_Uint16Array:
    pcStack_10 = L"Uint16Array";
    break;
  case TypeIds_Int32Array:
    pcStack_10 = L"Int32Array";
    break;
  case TypeIds_Uint32Array:
    pcStack_10 = L"Uint32Array";
    break;
  case TypeIds_Float32Array:
    pcStack_10 = L"Float32Array";
    break;
  case TypeIds_Float64Array:
    pcStack_10 = L"Float64Array";
    break;
  case TypeIds_Int64Array:
    pcStack_10 = L"Int64Array";
    break;
  case TypeIds_Uint64Array:
    pcStack_10 = L"Uint64Array";
    break;
  case TypeIds_DataView:
    pcStack_10 = L"DataView";
    break;
  case TypeIds_Map:
    pcStack_10 = L"Map";
    break;
  case TypeIds_Set:
    pcStack_10 = L"Set";
    break;
  case TypeIds_WeakMap:
    pcStack_10 = L"WeakMap";
    break;
  case TypeIds_WeakSet:
    pcStack_10 = L"WeakSet";
    break;
  case TypeIds_SymbolObject:
    pcStack_10 = L"Symbol";
    break;
  case TypeIds_Generator:
    pcStack_10 = L"Generator";
    break;
  case TypeIds_AsyncGenerator:
    pcStack_10 = L"AsyncGenerator";
    break;
  case TypeIds_AsyncFromSyncIterator:
    pcStack_10 = L"AsyncFromSyncIterator";
    break;
  case TypeIds_Promise:
    pcStack_10 = L"Promise";
    break;
  case TypeIds_WebAssemblyModule:
    pcStack_10 = L"WebAssembly.Module";
    break;
  case TypeIds_WebAssemblyInstance:
    pcStack_10 = L"WebAssembly.Instance";
    break;
  case TypeIds_WebAssemblyMemory:
    pcStack_10 = L"WebAssembly.Memory";
    break;
  case TypeIds_LastBuiltinDynamicObject:
    pcStack_10 = L"WebAssembly.Table";
    break;
  case TypeIds_GlobalObject:
    pcStack_10 = L"Object";
    break;
  case TypeIds_SpreadArgument:
    pcStack_10 = L"Spread";
  }
  return pcStack_10;
}

Assistant:

const char16 * JsrtDebugUtils::GetClassName(Js::TypeId typeId)
{
    switch (typeId)
    {
    case Js::TypeIds_Object:
    case Js::TypeIds_ArrayIterator:
    case Js::TypeIds_MapIterator:
    case Js::TypeIds_SetIterator:
    case Js::TypeIds_StringIterator:
                                            return _u("Object");

    case Js::TypeIds_Proxy:                 return _u("Proxy");
    case Js::TypeIds_Array:
    case Js::TypeIds_NativeIntArray:
#if ENABLE_COPYONACCESS_ARRAY
    case Js::TypeIds_CopyOnAccessNativeIntArray:
#endif
    case Js::TypeIds_NativeFloatArray:
    case Js::TypeIds_ES5Array:
    case Js::TypeIds_CharArray:
    case Js::TypeIds_BoolArray:
                                            return _u("Array");

    case Js::TypeIds_Date:
                                            return _u("Date");

    case Js::TypeIds_RegEx:                 return _u("RegExp");
    case Js::TypeIds_Error:                 return _u("Error");
    case Js::TypeIds_BooleanObject:         return _u("Boolean");
    case Js::TypeIds_NumberObject:          return _u("Number");
    case Js::TypeIds_StringObject:          return _u("String");
    case Js::TypeIds_Arguments:             return _u("Object");
    case Js::TypeIds_ArrayBuffer:           return _u("ArrayBuffer");
    case Js::TypeIds_Int8Array:             return _u("Int8Array");
    case Js::TypeIds_Uint8Array:            return _u("Uint8Array");
    case Js::TypeIds_Uint8ClampedArray:     return _u("Uint8ClampedArray");
    case Js::TypeIds_Int16Array:            return _u("Int16Array");
    case Js::TypeIds_Uint16Array:           return _u("Uint16Array");
    case Js::TypeIds_Int32Array:            return _u("Int32Array");
    case Js::TypeIds_Uint32Array:           return _u("Uint32Array");
    case Js::TypeIds_Float32Array:          return _u("Float32Array");
    case Js::TypeIds_Float64Array:          return _u("Float64Array");
    case Js::TypeIds_Int64Array:            return _u("Int64Array");
    case Js::TypeIds_Uint64Array:           return _u("Uint64Array");
    case Js::TypeIds_DataView:              return _u("DataView");
    case Js::TypeIds_Map:                   return _u("Map");
    case Js::TypeIds_Set:                   return _u("Set");
    case Js::TypeIds_WeakMap:               return _u("WeakMap");
    case Js::TypeIds_WeakSet:               return _u("WeakSet");
    case Js::TypeIds_SymbolObject:          return _u("Symbol");
    case Js::TypeIds_Generator:             return _u("Generator");
    case Js::TypeIds_AsyncGenerator:        return _u("AsyncGenerator");
    case Js::TypeIds_AsyncFromSyncIterator: return _u("AsyncFromSyncIterator");
    case Js::TypeIds_Promise:               return _u("Promise");
    case Js::TypeIds_GlobalObject:          return _u("Object");
    case Js::TypeIds_SpreadArgument:        return _u("Spread");
#ifdef ENABLE_WASM
    case Js::TypeIds_WebAssemblyModule:     return _u("WebAssembly.Module");
    case Js::TypeIds_WebAssemblyInstance:   return _u("WebAssembly.Instance");
    case Js::TypeIds_WebAssemblyMemory:     return _u("WebAssembly.Memory");
    case Js::TypeIds_WebAssemblyTable:      return _u("WebAssembly.Table");
#endif
    default:
        Assert(false);
    }
    return _u("");
}